

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O2

int64_t memory_read_seek(archive *a,void *client_data,int64_t offset,int whence)

{
  ulong uVar1;
  ulong uVar2;
  int64_t iStack_8;
  
  if (whence == 2) {
    uVar2 = offset + *(long *)((long)client_data + 0x10);
  }
  else if (whence == 1) {
    uVar2 = offset + *(long *)((long)client_data + 8);
  }
  else {
    if (whence != 0) {
      return -0x1e;
    }
    uVar2 = offset + *client_data;
  }
  *(ulong *)((long)client_data + 8) = uVar2;
  uVar1 = *client_data;
  iStack_8 = uVar2 - uVar1;
  if ((uVar2 < uVar1) || (uVar1 = *(ulong *)((long)client_data + 0x10), uVar1 < uVar2)) {
    *(ulong *)((long)client_data + 8) = uVar1;
    iStack_8 = -0x19;
  }
  return iStack_8;
}

Assistant:

static int64_t
memory_read_seek(struct archive *a, void *_private, int64_t offset, int whence)
{
	struct fileblocks *private = _private;

	(void)a;
	if (whence == SEEK_END) {
		offset = private->filesize + offset;
		whence = SEEK_SET;
	} else if (whence == SEEK_CUR) {
		offset = private->fileposition + offset;
		whence = SEEK_SET;
	}

	if (offset < 0) {
		fprintf(stderr, "\n\n\nInternal failure: negative seek\n\n\n");
		exit(1);
	}

	/* We've converted the request into a SEEK_SET. */
	private->fileposition = offset;

	/* Walk the block list to find the new position. */
	offset = 0;
	private->current = private->first;
	while (private->current != NULL) {
		if (offset + private->current->size > private->fileposition) {
			/* Position is in this block. */
			private->buff = (char *)private->current->buff
			    + private->fileposition - offset;
			private->gap_remaining = private->current->gap_size;
			return private->fileposition;
		}
		offset += private->current->size;
		if (offset + private->current->gap_size > private->fileposition) {
			/* Position is in this gap. */
			private->buff = NULL;
			private->gap_remaining = private->current->gap_size
			    - (private->fileposition - offset);
			return private->fileposition;
		}
		offset += private->current->gap_size;
		/* Skip to next block. */
		private->current = private->current->next;
	}
	if (private->fileposition == private->filesize) {
		return private->fileposition;
	}
	fprintf(stderr, "\n\n\nInternal failure: over-sized seek\n\n\n");
	exit(1);
}